

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

void trigger_setup(void)

{
  t_symbol *ptVar1;
  
  ptVar1 = gensym("trigger");
  trigger_class = class_new(ptVar1,trigger_new,trigger_free,0x40,0,A_GIMME,0);
  ptVar1 = gensym("t");
  class_addcreator(trigger_new,ptVar1,A_GIMME,0);
  class_addlist(trigger_class,trigger_list);
  class_addbang(trigger_class,trigger_bang);
  class_addpointer(trigger_class,trigger_pointer);
  class_doaddfloat(trigger_class,trigger_float);
  class_addsymbol(trigger_class,trigger_symbol);
  class_addanything(trigger_class,trigger_anything);
  return;
}

Assistant:

static void trigger_setup(void)
{
    trigger_class = class_new(gensym("trigger"), (t_newmethod)trigger_new,
        (t_method)trigger_free, sizeof(t_trigger), 0, A_GIMME, 0);
    class_addcreator((t_newmethod)trigger_new, gensym("t"), A_GIMME, 0);
    class_addlist(trigger_class, trigger_list);
    class_addbang(trigger_class, trigger_bang);
    class_addpointer(trigger_class, trigger_pointer);
    class_addfloat(trigger_class, (t_method)trigger_float);
    class_addsymbol(trigger_class, trigger_symbol);
    class_addanything(trigger_class, trigger_anything);
}